

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

Status cmSystemTools::MakeTempDirectory(char *path,mode_t *mode)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  Status SVar4;
  string_view str;
  
  SVar4.Kind_ = POSIX;
  SVar4.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x16;
  if (path != (char *)0x0) {
    sVar2 = strlen(path);
    str._M_str = path;
    str._M_len = sVar2;
    bVar1 = cmHasLiteralSuffix<7ul>(str,(char (*) [7])0x7710dc);
    pcVar3 = path;
    if (bVar1) {
      while (pcVar3 = strchr(pcVar3,0x2f), pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
        Mkdir(path,mode);
        *pcVar3 = '/';
        pcVar3 = pcVar3 + 1;
      }
      pcVar3 = mkdtemp(path);
      if (pcVar3 == (char *)0x0) {
        SVar4 = cmsys::Status::POSIX_errno();
        return SVar4;
      }
      if (mode != (mode_t *)0x0) {
        chmod(path,*mode);
      }
      SVar4.Kind_ = Success;
      SVar4.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
    }
  }
  return SVar4;
}

Assistant:

cmsys::Status cmSystemTools::MakeTempDirectory(char* path, const mode_t* mode)
{
  if (!path) {
    return cmsys::Status::POSIX(EINVAL);
  }

  // verify that path ends with "XXXXXX"
  const auto l = std::strlen(path);
  if (!cmHasLiteralSuffix(cm::string_view{ path, l }, "XXXXXX")) {
    return cmsys::Status::POSIX(EINVAL);
  }

  // create parent directories
  auto* sep = path;
  while ((sep = strchr(sep, '/'))) {
    // all underlying functions use C strings,
    // so temporarily end the string here
    *sep = '\0';
    Mkdir(path, mode);

    *sep = '/';
    ++sep;
  }

#ifdef _WIN32
  const int nchars = 36;
  const char chars[nchars + 1] = "abcdefghijklmnopqrstuvwxyz0123456789";

  std::random_device rd;
  std::mt19937 rg{ rd() };
  std::uniform_int_distribution<int> dist{ 0, nchars - 1 };

  for (auto tries = 100; tries; --tries) {
    for (auto n = l - 6; n < l; ++n) {
      path[n] = chars[dist(rg)];
    }
    if (Mkdir(path, mode) == 0) {
      return cmsys::Status::Success();
    } else if (errno != EEXIST) {
      return cmsys::Status::POSIX_errno();
    }
  }
  return cmsys::Status::POSIX(EAGAIN);
#else
  if (mkdtemp(path)) {
    if (mode) {
      chmod(path, *mode);
    }
  } else {
    return cmsys::Status::POSIX_errno();
  }
  return cmsys::Status::Success();
#endif
}